

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtAxisSweep3Internal.h
# Opt level: O1

void __thiscall
cbtAxisSweep3Internal<unsigned_int>::calculateOverlappingPairs
          (cbtAxisSweep3Internal<unsigned_int> *this,cbtDispatcher *dispatcher)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  cbtBroadphasePair *pcVar4;
  cbtBroadphaseProxy *pcVar5;
  cbtBroadphaseProxy *pcVar6;
  ulong uVar7;
  int iVar8;
  cbtAlignedObjectArray<cbtBroadphasePair> *this_00;
  cbtBroadphasePair *pcVar9;
  long lVar10;
  ulong uVar11;
  Handle *pHandleA;
  cbtBroadphaseProxy *pcVar12;
  int iVar13;
  long lVar14;
  long lVar15;
  Handle *pHandleB;
  cbtBroadphaseProxy *pcVar16;
  cbtBroadphasePairSortPredicate local_3a;
  cbtBroadphasePairSortPredicate local_39;
  cbtDispatcher *local_38;
  undefined4 extraout_var;
  
  local_38 = dispatcher;
  iVar8 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [0xf])();
  if ((char)iVar8 != '\0') {
    iVar8 = (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
              [7])();
    this_00 = (cbtAlignedObjectArray<cbtBroadphasePair> *)CONCAT44(extraout_var,iVar8);
    if (1 < this_00->m_size) {
      cbtAlignedObjectArray<cbtBroadphasePair>::quickSortInternal<cbtBroadphasePairSortPredicate>
                (this_00,&local_39,0,this_00->m_size + -1);
    }
    iVar8 = this_00->m_size;
    iVar2 = this->m_invalidPair;
    lVar15 = (long)iVar2;
    lVar14 = iVar8 - lVar15;
    iVar13 = (int)lVar14;
    if ((lVar15 < 1) && (iVar2 < 0)) {
      if (this_00->m_capacity < iVar13) {
        if (iVar8 == iVar2) {
          pcVar9 = (cbtBroadphasePair *)0x0;
        }
        else {
          pcVar9 = (cbtBroadphasePair *)cbtAlignedAllocInternal(lVar14 * 0x20,0x10);
        }
        iVar3 = this_00->m_size;
        if (0 < (long)iVar3) {
          lVar10 = 0;
          do {
            pcVar4 = this_00->m_data;
            *(undefined8 *)((long)&pcVar9->m_pProxy0 + lVar10) =
                 *(undefined8 *)((long)&pcVar4->m_pProxy0 + lVar10);
            *(undefined8 *)((long)&pcVar9->m_pProxy1 + lVar10) =
                 *(undefined8 *)((long)&pcVar4->m_pProxy1 + lVar10);
            *(undefined8 *)((long)&pcVar9->m_algorithm + lVar10) =
                 *(undefined8 *)((long)&pcVar4->m_algorithm + lVar10);
            *(undefined8 *)((long)&pcVar9->field_3 + lVar10) =
                 *(undefined8 *)((long)&pcVar4->field_3 + lVar10);
            lVar10 = lVar10 + 0x20;
          } while ((long)iVar3 * 0x20 != lVar10);
        }
        if (this_00->m_data != (cbtBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            cbtAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (cbtBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pcVar9;
        this_00->m_capacity = iVar13;
      }
      if (iVar2 < 0) {
        lVar10 = (long)iVar8 << 5;
        do {
          *(undefined1 (*) [32])((long)&this_00->m_data->m_pProxy0 + lVar10) =
               ZEXT1632(ZEXT816(0) << 0x40);
          lVar10 = lVar10 + 0x20;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0);
      }
    }
    this_00->m_size = iVar13;
    this->m_invalidPair = 0;
    if (0 < iVar13) {
      lVar15 = 0;
      pcVar12 = (cbtBroadphaseProxy *)0x0;
      pcVar16 = (cbtBroadphaseProxy *)0x0;
      do {
        pcVar9 = this_00->m_data;
        pcVar5 = pcVar9[lVar15].m_pProxy0;
        pcVar6 = pcVar9[lVar15].m_pProxy1;
        if (((pcVar16 == pcVar6 && pcVar12 == pcVar5) ||
            ((uint)pcVar5[1].m_collisionFilterGroup < *(uint *)&pcVar6->field_0x34)) ||
           ((uint)pcVar6[1].m_collisionFilterGroup < *(uint *)&pcVar5->field_0x34)) {
LAB_008c2645:
          pcVar9 = pcVar9 + lVar15;
          (*(this->m_pairCache->super_cbtOverlappingPairCallback)._vptr_cbtOverlappingPairCallback
            [8])(this->m_pairCache,pcVar9,local_38);
          pcVar9->m_pProxy0 = (cbtBroadphaseProxy *)SUB168(ZEXT816(0) << 0x40,0);
          pcVar9->m_pProxy1 = (cbtBroadphaseProxy *)SUB168(ZEXT816(0) << 0x40,8);
          this->m_invalidPair = this->m_invalidPair + 1;
        }
        else {
          uVar7 = 0;
          do {
            uVar11 = uVar7;
            if ((uVar11 == 2) ||
               ((uint)pcVar5[1].m_aabbMin.m_floats[uVar11 - 2] <
                (uint)pcVar6[1].m_aabbMin.m_floats[uVar11 - 5])) break;
            uVar7 = uVar11 + 1;
          } while ((uint)pcVar5[1].m_aabbMin.m_floats[uVar11 - 5] <=
                   (uint)pcVar6[1].m_aabbMin.m_floats[uVar11 - 2]);
          if (uVar11 < 2) goto LAB_008c2645;
        }
        lVar15 = lVar15 + 1;
        lVar14 = (long)this_00->m_size;
        pcVar12 = pcVar5;
        pcVar16 = pcVar6;
      } while (lVar15 < lVar14);
    }
    if (1 < (int)lVar14) {
      cbtAlignedObjectArray<cbtBroadphasePair>::quickSortInternal<cbtBroadphasePairSortPredicate>
                (this_00,&local_3a,0,(int)lVar14 + -1);
    }
    iVar8 = this_00->m_size;
    iVar2 = this->m_invalidPair;
    lVar14 = (long)iVar2;
    lVar15 = iVar8 - lVar14;
    iVar13 = (int)lVar15;
    if ((lVar14 < 1) && (iVar2 < 0)) {
      if (this_00->m_capacity < iVar13) {
        if (iVar8 == iVar2) {
          pcVar9 = (cbtBroadphasePair *)0x0;
        }
        else {
          pcVar9 = (cbtBroadphasePair *)cbtAlignedAllocInternal(lVar15 * 0x20,0x10);
        }
        iVar3 = this_00->m_size;
        if (0 < (long)iVar3) {
          lVar15 = 0;
          do {
            pcVar4 = this_00->m_data;
            *(undefined8 *)((long)&pcVar9->m_pProxy0 + lVar15) =
                 *(undefined8 *)((long)&pcVar4->m_pProxy0 + lVar15);
            *(undefined8 *)((long)&pcVar9->m_pProxy1 + lVar15) =
                 *(undefined8 *)((long)&pcVar4->m_pProxy1 + lVar15);
            *(undefined8 *)((long)&pcVar9->m_algorithm + lVar15) =
                 *(undefined8 *)((long)&pcVar4->m_algorithm + lVar15);
            *(undefined8 *)((long)&pcVar9->field_3 + lVar15) =
                 *(undefined8 *)((long)&pcVar4->field_3 + lVar15);
            lVar15 = lVar15 + 0x20;
          } while ((long)iVar3 * 0x20 != lVar15);
        }
        if (this_00->m_data != (cbtBroadphasePair *)0x0) {
          if (this_00->m_ownsMemory == true) {
            cbtAlignedFreeInternal(this_00->m_data);
          }
          this_00->m_data = (cbtBroadphasePair *)0x0;
        }
        this_00->m_ownsMemory = true;
        this_00->m_data = pcVar9;
        this_00->m_capacity = iVar13;
      }
      if (iVar2 < 0) {
        lVar15 = (long)iVar8 << 5;
        do {
          puVar1 = (undefined8 *)((long)&this_00->m_data->m_pProxy0 + lVar15);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1[2] = 0;
          puVar1[3] = 0;
          lVar15 = lVar15 + 0x20;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 0);
      }
    }
    this_00->m_size = iVar13;
    this->m_invalidPair = 0;
  }
  return;
}

Assistant:

void cbtAxisSweep3Internal<BP_FP_INT_TYPE>::calculateOverlappingPairs(cbtDispatcher* dispatcher)
{
	if (m_pairCache->hasDeferredRemoval())
	{
		cbtBroadphasePairArray& overlappingPairArray = m_pairCache->getOverlappingPairArray();

		//perform a sort, to find duplicates and to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;

		int i;

		cbtBroadphasePair previousPair;
		previousPair.m_pProxy0 = 0;
		previousPair.m_pProxy1 = 0;
		previousPair.m_algorithm = 0;

		for (i = 0; i < overlappingPairArray.size(); i++)
		{
			cbtBroadphasePair& pair = overlappingPairArray[i];

			bool isDuplicate = (pair == previousPair);

			previousPair = pair;

			bool needsRemoval = false;

			if (!isDuplicate)
			{
				///important to use an AABB test that is consistent with the broadphase
				bool hasOverlap = testAabbOverlap(pair.m_pProxy0, pair.m_pProxy1);

				if (hasOverlap)
				{
					needsRemoval = false;  //callback->processOverlap(pair);
				}
				else
				{
					needsRemoval = true;
				}
			}
			else
			{
				//remove duplicate
				needsRemoval = true;
				//should have no algorithm
				cbtAssert(!pair.m_algorithm);
			}

			if (needsRemoval)
			{
				m_pairCache->cleanOverlappingPair(pair, dispatcher);

				//		m_overlappingPairArray.swap(i,m_overlappingPairArray.size()-1);
				//		m_overlappingPairArray.pop_back();
				pair.m_pProxy0 = 0;
				pair.m_pProxy1 = 0;
				m_invalidPair++;
			}
		}

///if you don't like to skip the invalid pairs in the array, execute following code:
#define CLEAN_INVALID_PAIRS 1
#ifdef CLEAN_INVALID_PAIRS

		//perform a sort, to sort 'invalid' pairs to the end
		overlappingPairArray.quickSort(cbtBroadphasePairSortPredicate());

		overlappingPairArray.resize(overlappingPairArray.size() - m_invalidPair);
		m_invalidPair = 0;
#endif  //CLEAN_INVALID_PAIRS

		//printf("overlappingPairArray.size()=%d\n",overlappingPairArray.size());
	}
}